

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

Token * __thiscall llbuild::ninja::Lexer::setIdentifierTokenKind(Lexer *this,Token *result)

{
  int iVar1;
  Token *pTVar2;
  uint length;
  Token *result_local;
  Lexer *this_local;
  
  switch(*(int *)&this->bufferPos - *(int *)&result->start) {
  case 4:
    if (*(int *)result->start == 0x656c7572) {
      pTVar2 = setTokenKind(this,result,KWRule);
      return pTVar2;
    }
    if (*(int *)result->start == 0x6c6f6f70) {
      pTVar2 = setTokenKind(this,result,KWPool);
      return pTVar2;
    }
    break;
  case 5:
    iVar1 = memcmp("build",result->start,5);
    if (iVar1 == 0) {
      pTVar2 = setTokenKind(this,result,KWBuild);
      return pTVar2;
    }
    break;
  case 7:
    iVar1 = memcmp("default",result->start,7);
    if (iVar1 == 0) {
      pTVar2 = setTokenKind(this,result,KWDefault);
      return pTVar2;
    }
    iVar1 = memcmp("include",result->start,7);
    if (iVar1 == 0) {
      pTVar2 = setTokenKind(this,result,KWInclude);
      return pTVar2;
    }
    break;
  case 8:
    iVar1 = memcmp("subninja",result->start,7);
    if (iVar1 == 0) {
      pTVar2 = setTokenKind(this,result,KWKindLast);
      return pTVar2;
    }
  }
  pTVar2 = setTokenKind(this,result,Identifier);
  return pTVar2;
}

Assistant:

Token& Lexer::setIdentifierTokenKind(Token& result) const {
  unsigned length = bufferPos - result.start;
  switch (length) {
  case 4:
    if (memcmp("rule", result.start, 4) == 0)
      return setTokenKind(result, Token::Kind::KWRule);
    if (memcmp("pool", result.start, 4) == 0)
      return setTokenKind(result, Token::Kind::KWPool);
    break;

  case 5:
    if (memcmp("build", result.start, 5) == 0)
      return setTokenKind(result, Token::Kind::KWBuild);
    break;

  case 7:
    if (memcmp("default", result.start, 7) == 0)
      return setTokenKind(result, Token::Kind::KWDefault);
    if (memcmp("include", result.start, 7) == 0)
      return setTokenKind(result, Token::Kind::KWInclude);
    break;

  case 8:
    if (memcmp("subninja", result.start, 7) == 0)
      return setTokenKind(result, Token::Kind::KWSubninja);
    break;
  }

  return setTokenKind(result, Token::Kind::Identifier);
}